

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986Authority(xmlURIPtr uri,char **str)

{
  bool bVar1;
  int iVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *cur;
  byte *local_38;
  ulong uVar8;
  
  pbVar4 = (byte *)*str;
  pbVar10 = pbVar4;
  do {
    bVar5 = *pbVar10;
    if ((9 < (byte)(bVar5 - 0x30)) && (0x19 < (byte)((bVar5 & 0xdf) + 0xbf))) {
      uVar6 = bVar5 - 0x21;
      uVar8 = (ulong)uVar6;
      if (uVar6 < 0x3f) {
        if ((0x4000000016003fe9U >> (uVar8 & 0x3f) & 1) == 0) {
          if (uVar8 != 4) {
            if (uVar8 != 0x1f) goto LAB_0018dbcd;
            goto LAB_0018dbde;
          }
          if (((9 < (byte)(pbVar10[1] - 0x30)) &&
              ((uVar9 = pbVar10[1] - 0x41, 0x25 < uVar9 ||
               ((0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0)))) ||
             ((9 < (byte)(pbVar10[2] - 0x30) &&
              ((uVar9 = pbVar10[2] - 0x41, 0x25 < uVar9 ||
               ((0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0)))))) {
            if (0x1f < uVar6) goto LAB_0018dbd4;
            if ((0x16000fe9U >> (uVar6 & 0x1f) & 1) == 0) break;
          }
        }
      }
      else {
LAB_0018dbcd:
        if (bVar5 != 0x7e) goto LAB_0018dbd4;
      }
    }
    pbVar10 = pbVar10 + (ulong)(bVar5 == 0x25) * 2 + 1;
  } while( true );
  if (uVar6 == 0x1f) {
LAB_0018dbde:
    bVar1 = true;
    if (uri != (xmlURIPtr)0x0) {
      if (uri->user != (char *)0x0) {
        (*xmlFree)(uri->user);
      }
      iVar7 = (int)pbVar10 - (int)pbVar4;
      if ((uri->cleanup & 2) == 0) {
        pxVar3 = (xmlChar *)xmlURIUnescapeString((char *)pbVar4,iVar7,(char *)0x0);
      }
      else {
        pxVar3 = xmlStrndup(pbVar4,iVar7);
      }
      uri->user = (char *)pxVar3;
    }
  }
  else {
LAB_0018dbd4:
    bVar1 = false;
    pbVar10 = pbVar4;
  }
  if ((bVar1) && (*pbVar10 == 0x40)) {
    pbVar10 = pbVar10 + 1;
  }
  else {
    pbVar10 = (byte *)*str;
  }
  if (*pbVar10 != 0x5b) {
    pbVar4 = pbVar10;
    if ((((byte)(*pbVar10 - 0x30) < 10) &&
        (local_38 = pbVar10, iVar7 = xmlParse3986DecOctet((char **)&local_38), iVar7 == 0)) &&
       (*local_38 == 0x2e)) {
      local_38 = local_38 + 1;
      iVar7 = xmlParse3986DecOctet((char **)&local_38);
      if (((iVar7 == 0) && (*local_38 == 0x2e)) &&
         ((iVar7 = xmlParse3986DecOctet((char **)&local_38), iVar7 == 0 &&
          ((*local_38 == 0x2e && (iVar7 = xmlParse3986DecOctet((char **)&local_38), iVar7 == 0))))))
      goto LAB_0018dd68;
    }
    do {
      bVar5 = *pbVar4;
      if ((9 < (byte)(bVar5 - 0x30)) && (0x19 < (byte)((bVar5 & 0xdf) + 0xbf))) {
        uVar6 = bVar5 - 0x21;
        local_38 = pbVar4;
        if (uVar6 < 0x3f) {
          if ((0x4000000014003fe9U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            if ((ulong)uVar6 != 4) goto LAB_0018dd5f;
            if ((((9 < (byte)(pbVar4[1] - 0x30)) &&
                 ((uVar6 = pbVar4[1] - 0x41, 0x25 < uVar6 ||
                  ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) ||
                ((9 < (byte)(pbVar4[2] - 0x30) &&
                 ((uVar6 = pbVar4[2] - 0x41, 0x25 < uVar6 ||
                  ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))))) &&
               ((0x3d < bVar5 || ((0x28001fd200000000U >> ((ulong)bVar5 & 0x3f) & 1) == 0))))
            goto LAB_0018dd68;
          }
        }
        else {
LAB_0018dd5f:
          if (bVar5 != 0x7e) goto LAB_0018dd68;
        }
      }
      pbVar4 = pbVar4 + (ulong)(bVar5 == 0x25) * 2 + 1;
    } while( true );
  }
  local_38 = pbVar10 + 1;
  do {
    bVar5 = *local_38;
    local_38 = local_38 + 1;
    if (bVar5 == 0) {
      iVar7 = 1;
      bVar1 = false;
      goto LAB_0018dde0;
    }
  } while (bVar5 != 0x5d);
LAB_0018dd68:
  if (uri != (xmlURIPtr)0x0) {
    if (uri->authority != (char *)0x0) {
      (*xmlFree)(uri->authority);
    }
    uri->authority = (char *)0x0;
    if (uri->server != (char *)0x0) {
      (*xmlFree)(uri->server);
    }
    if (local_38 == pbVar10) {
      pxVar3 = (xmlChar *)0x0;
    }
    else {
      iVar7 = (int)local_38 - (int)pbVar10;
      if ((uri->cleanup & 2) == 0) {
        pxVar3 = (xmlChar *)xmlURIUnescapeString((char *)pbVar10,iVar7,(char *)0x0);
      }
      else {
        pxVar3 = xmlStrndup(pbVar10,iVar7);
      }
    }
    uri->server = (char *)pxVar3;
  }
  iVar7 = 0;
  bVar1 = true;
  pbVar10 = local_38;
LAB_0018dde0:
  if (bVar1) {
    if (*pbVar10 == 0x3a) {
      pbVar4 = pbVar10 + 1;
      pbVar11 = pbVar10 + 1;
      iVar2 = 1;
      iVar7 = 0;
      pbVar10 = pbVar11;
      if ((byte)(*pbVar4 - 0x30) < 10) {
        do {
          bVar5 = *pbVar10 - 0x30;
          if (9 < bVar5) {
            iVar2 = 0;
            bVar1 = true;
            if (uri != (xmlURIPtr)0x0) {
              uri->port = iVar7;
            }
            goto LAB_0018de53;
          }
          if (iVar7 < 0xccccccd) {
            iVar7 = iVar7 * 10;
            if ((int)(bVar5 ^ 0x7fffffff) < iVar7) goto LAB_0018de2d;
            iVar7 = iVar7 + (uint)bVar5;
            pbVar10 = pbVar10 + 1;
            bVar1 = true;
          }
          else {
LAB_0018de2d:
            bVar1 = false;
          }
        } while (bVar1);
      }
      bVar1 = false;
      pbVar10 = pbVar11;
LAB_0018de53:
      if (!bVar1) {
        return iVar2;
      }
    }
    *str = (char *)pbVar10;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int
xmlParse3986Authority(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;
    /*
     * try to parse an userinfo and check for the trailing @
     */
    ret = xmlParse3986Userinfo(uri, &cur);
    if ((ret != 0) || (*cur != '@'))
        cur = *str;
    else
        cur++;
    ret = xmlParse3986Host(uri, &cur);
    if (ret != 0) return(ret);
    if (*cur == ':') {
        cur++;
        ret = xmlParse3986Port(uri, &cur);
	if (ret != 0) return(ret);
    }
    *str = cur;
    return(0);
}